

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O2

bool __thiscall
google::protobuf::SimpleDescriptorDatabase::
DescriptorIndex<const_google::protobuf::FileDescriptorProto_*>::AddExtension
          (DescriptorIndex<const_google::protobuf::FileDescriptorProto_*> *this,string *filename,
          FieldDescriptorProto *field,FileDescriptorProto *value)

{
  LogMessage *pLVar1;
  bool bVar2;
  undefined8 *puVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_90;
  size_type local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  FileDescriptorProto *value_local;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_68;
  pair<absl::lts_20240722::container_internal::btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_const_google::protobuf::FileDescriptorProto_*,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_const_google::protobuf::FileDescriptorProto_*>_>,_256,_false>_>,_std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_const_google::protobuf::FileDescriptorProto_*>_&,_std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_const_google::protobuf::FileDescriptorProto_*>_*>,_bool>
  local_40;
  
  puVar3 = (undefined8 *)
           ((ulong)(field->field_0)._impl_.extendee_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
  bVar2 = true;
  if ((puVar3[1] != 0) && (*(char *)*puVar3 == '.')) {
    value_local = value;
    std::__cxx11::string::substr((ulong)&local_90,(ulong)puVar3);
    local_68.first._M_string_length = local_88;
    local_68.second = (field->field_0)._impl_.number_;
    local_68.first._M_dataplus._M_p = (pointer)&local_68.first.field_2;
    if (local_90 == &local_80) {
      local_68.first.field_2._8_8_ = local_80._8_8_;
    }
    else {
      local_68.first._M_dataplus._M_p = (pointer)local_90;
    }
    local_88 = 0;
    local_80._M_local_buf[0] = '\0';
    local_90 = &local_80;
    absl::lts_20240722::container_internal::
    btree_set_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::map_params<std::pair<std::__cxx11::string,int>,google::protobuf::FileDescriptorProto_const*,std::less<std::pair<std::__cxx11::string,int>>,std::allocator<std::pair<std::pair<std::__cxx11::string,int>const,google::protobuf::FileDescriptorProto_const*>>,256,false>>>
    ::emplace<std::pair<std::__cxx11::string,int>,google::protobuf::FileDescriptorProto_const*&>
              (&local_40,&this->by_extension_,&local_68,&value_local);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_90);
    if (local_40.second == false) {
      absl::lts_20240722::log_internal::LogMessage::LogMessage
                ((LogMessage *)&local_68,
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/descriptor_database.cc"
                 ,0x105);
      pLVar1 = absl::lts_20240722::log_internal::LogMessage::operator<<
                         ((LogMessage *)&local_68,
                          (char (*) [64])
                          "Extension conflicts with extension already in database: extend ");
      pLVar1 = (LogMessage *)
               absl::lts_20240722::log_internal::LogMessage::operator<<
                         (pLVar1,(string *)
                                 ((ulong)(field->field_0)._impl_.extendee_.tagged_ptr_.ptr_ &
                                 0xfffffffffffffffc));
      pLVar1 = absl::lts_20240722::log_internal::LogMessage::operator<<(pLVar1,(char (*) [4])" { ");
      pLVar1 = (LogMessage *)
               absl::lts_20240722::log_internal::LogMessage::operator<<
                         (pLVar1,(string *)
                                 ((ulong)(field->field_0)._impl_.name_.tagged_ptr_.ptr_ &
                                 0xfffffffffffffffc));
      pLVar1 = absl::lts_20240722::log_internal::LogMessage::operator<<
                         (pLVar1,(char (*) [4])0x3d999d);
      pLVar1 = absl::lts_20240722::log_internal::LogMessage::operator<<
                         (pLVar1,(field->field_0)._impl_.number_);
      pLVar1 = absl::lts_20240722::log_internal::LogMessage::operator<<
                         (pLVar1,(char (*) [9])" } from:");
      absl::lts_20240722::log_internal::LogMessage::operator<<(pLVar1,(string *)filename);
      absl::lts_20240722::log_internal::LogMessage::~LogMessage((LogMessage *)&local_68);
      bVar2 = false;
    }
  }
  return bVar2;
}

Assistant:

bool SimpleDescriptorDatabase::DescriptorIndex<Value>::AddExtension(
    const std::string& filename, const FieldDescriptorProto& field,
    Value value) {
  if (!field.extendee().empty() && field.extendee()[0] == '.') {
    // The extension is fully-qualified.  We can use it as a lookup key in
    // the by_symbol_ table.
    if (!by_extension_
             .emplace(
                 std::make_pair(field.extendee().substr(1), field.number()),
                 value)
             .second) {
      ABSL_LOG(ERROR)
          << "Extension conflicts with extension already in database: "
             "extend "
          << field.extendee() << " { " << field.name() << " = "
          << field.number() << " } from:" << filename;
      return false;
    }
  } else {
    // Not fully-qualified.  We can't really do anything here, unfortunately.
    // We don't consider this an error, though, because the descriptor is
    // valid.
  }
  return true;
}